

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall
kj::(anonymous_namespace)::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  anon_unknown_8::DiskAppendableFile::~DiskAppendableFile((DiskAppendableFile *)(this + -0x18));
  return;
}

Assistant:

DiskAppendableFile(AutoCloseFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}